

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

bool __thiscall
pstack::Dwarf::Unit::sourceFromAddr
          (Unit *this,Addr addr,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *info)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  ContainsAddr CVar2;
  pointer pLVar3;
  pointer pLVar4;
  element_type *peVar5;
  bool local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *dirname;
  __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
  next;
  __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
  local_70;
  iterator i;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *lines;
  undefined1 local_50 [8];
  DIE d;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *info_local;
  Addr addr_local;
  Unit *this_local;
  
  d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)info;
  root((DIE *)local_50,this);
  CVar2 = DIE::containsAddress((DIE *)local_50,addr);
  if (CVar2 == NO) {
    this_local._7_1_ = false;
  }
  else {
    i._M_current = (LineState *)getLines(this);
    bVar1 = std::operator==((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                             *)i._M_current,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pLVar3 = std::
               unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
               operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                           *)i._M_current);
      local_70._M_current =
           (LineState *)
           std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>::begin
                     (&pLVar3->matrix);
      while( true ) {
        pLVar3 = std::
                 unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                 ::operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                               *)i._M_current);
        next._M_current =
             (LineState *)
             std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>::end
                       (&pLVar3->matrix);
        bVar1 = __gnu_cxx::
                operator==<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                          (&local_70,&next);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pLVar4 = __gnu_cxx::
                 __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                 ::operator->(&local_70);
        if (((byte)pLVar4->field_0x18 >> 2 & 1) == 0) {
          dirname = (string *)
                    __gnu_cxx::
                    __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                    ::operator+(&local_70,1);
          pLVar4 = __gnu_cxx::
                   __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                   ::operator->(&local_70);
          if ((pLVar4->addr <= addr) &&
             (pLVar4 = __gnu_cxx::
                       __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                       ::operator->((__normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                                     *)&dirname), addr < pLVar4->addr)) {
            pLVar3 = std::
                     unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                     ::operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                                   *)i._M_current);
            pLVar4 = __gnu_cxx::
                     __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                     ::operator->(&local_70);
            local_88 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&pLVar3->directories,(ulong)pLVar4->file->dirindex);
            this_00 = d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            peVar5 = std::
                     __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->dwarf->elf);
            local_c9 = peVar5->context->verbose == 0;
            if (local_c9) {
              pLVar4 = __gnu_cxx::
                       __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                       ::operator->(&local_70);
              std::__cxx11::string::string((string *)&local_a8,&pLVar4->file->name);
            }
            else {
              std::operator+(&local_c8,local_88,"/");
              pLVar4 = __gnu_cxx::
                       __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                       ::operator->(&local_70);
              std::operator+(&local_a8,&local_c8,&pLVar4->file->name);
            }
            local_c9 = !local_c9;
            pLVar4 = __gnu_cxx::
                     __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                     ::operator->(&local_70);
            std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::emplace_back<std::__cxx11::string,unsigned_int&>
                      ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                        *)this_00._M_pi,&local_a8,&pLVar4->line);
            std::__cxx11::string::~string((string *)&local_a8);
            if (local_c9) {
              std::__cxx11::string::~string((string *)&local_c8);
            }
            this_local._7_1_ = true;
            goto LAB_002440c2;
          }
        }
        __gnu_cxx::
        __normal_iterator<pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
        ::operator++(&local_70);
      }
    }
    this_local._7_1_ = false;
  }
LAB_002440c2:
  DIE::~DIE((DIE *)local_50);
  return this_local._7_1_;
}

Assistant:

bool
Unit::sourceFromAddr(Elf::Addr addr, std::vector<std::pair<std::string, int>> &info) {
    DIE d = root();
    if (d.containsAddress(addr) == ContainsAddr::NO)
        return false;
    const auto &lines = getLines();
    if (lines != nullptr) {
        for (auto i = lines->matrix.begin(); i != lines->matrix.end(); ++i) {
            if (i->end_sequence)
                continue;
            auto next = i+1;
            if (i->addr <= addr && next->addr > addr) {
                const std::string &dirname = lines->directories[i->file->dirindex];
                info.emplace_back(dwarf->elf->context.verbose != 0 ? dirname + "/" + i->file->name : i->file->name, i->line);
                return true;
            }
        }
    }
    return false;
}